

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

uint Cudd_ApaIntDivision(int digits,DdApaNumber dividend,uint divisor,DdApaNumber quotient)

{
  double dVar1;
  double ddiv;
  uint remainder;
  double partial;
  int i;
  DdApaNumber quotient_local;
  uint divisor_local;
  DdApaNumber dividend_local;
  int digits_local;
  
  ddiv._4_4_ = 0;
  for (partial._4_4_ = 0; partial._4_4_ < digits; partial._4_4_ = partial._4_4_ + 1) {
    dVar1 = (double)ddiv._4_4_ * 4294967296.0 + (double)dividend[partial._4_4_];
    quotient[partial._4_4_] = (DdApaDigit)(long)(dVar1 / (double)divisor);
    ddiv._4_4_ = (uint)(long)(dVar1 - (double)quotient[partial._4_4_] * (double)divisor);
  }
  return ddiv._4_4_;
}

Assistant:

unsigned int
Cudd_ApaIntDivision(
  int  digits,
  DdApaNumber dividend,
  unsigned int divisor,
  DdApaNumber quotient)
{
    int i;
    double partial;
    unsigned int remainder = 0;
    double ddiv = (double) divisor;

    for (i = 0; i < digits; i++) {
        partial = (double) remainder * DD_APA_BASE + dividend[i];
        quotient[i] = (DdApaDigit) (partial / ddiv);
        remainder = (unsigned int) (partial - ((double)quotient[i] * ddiv));
    }

    return(remainder);

}